

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<7,_4>::Type
          (Type<7,_4> *this,int zaid,double awr,int lat,int lasym,ScatteringLawConstants *constants,
          ScatteringLaw *law,EffectiveTemperature *principal,
          vector<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>,_std::allocator<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>_>_>
          *secondaries)

{
  int value;
  pointer poVar1;
  allocator<char> local_59;
  invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
  local_58;
  
  BaseWithoutMT<njoy::ENDFtk::section::Type<7,_4>_>::BaseWithoutMT
            (&this->super_BaseWithoutMT<njoy::ENDFtk::section::Type<7,_4>_>,zaid,awr);
  this->lat_ = lat;
  this->lasym_ = lasym;
  ListRecord::ListRecord(&(this->b_).super_ListRecord,&constants->super_ListRecord);
  std::__detail::__variant::
  _Move_ctor_base<false,_njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
  ::_Move_ctor_base((_Move_ctor_base<false,_njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
                     *)&this->law_,
                    (_Move_ctor_base<false,_njoy::ENDFtk::section::Type<7,_4>::AnalyticalFunctions,_njoy::ENDFtk::section::Type<7,_4>::TabulatedFunctions>
                     *)law);
  TabulationRecord::TabulationRecord
            (&(this->principal_).super_TabulationRecord,&principal->super_TabulationRecord);
  poVar1 = (secondaries->
           super__Vector_base<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>,_std::allocator<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->secondary_).
  super__Vector_base<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>,_std::allocator<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (secondaries->
       super__Vector_base<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>,_std::allocator<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->secondary_).
  super__Vector_base<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>,_std::allocator<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = poVar1;
  (this->secondary_).
  super__Vector_base<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>,_std::allocator<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (secondaries->
       super__Vector_base<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>,_std::allocator<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (secondaries->
  super__Vector_base<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>,_std::allocator<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (secondaries->
  super__Vector_base<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>,_std::allocator<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (secondaries->
  super__Vector_base<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>,_std::allocator<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ScatteringLawConstants::analyticalFunctionTypes(&local_58,&this->b_);
  Type<7,4>::
  verifySecondaryTemperatures<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>,std::vector<std::optional<njoy::ENDFtk::section::Type<7,4>::EffectiveTemperature>,std::allocator<std::optional<njoy::ENDFtk::section::Type<7,4>::EffectiveTemperature>>>>
            (&local_58,&this->secondary_);
  value = this->lat_;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"LAT",&local_59);
  checkValue(value,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

Type( int zaid, double awr, int lat, int lasym,
      ScatteringLawConstants&& constants,
      ScatteringLaw&& law,
      EffectiveTemperature&& principal,
      std::vector< std::optional< EffectiveTemperature > >
          secondaries = {} ) :
  BaseWithoutMT( zaid, awr ), lat_( lat ), lasym_( lasym ),
  b_( std::move( constants ) ), law_( std::move( law ) ),
  principal_( std::move( principal ) ),
  secondary_( std::move( secondaries ) ) {

  verifySecondaryTemperatures( this->b_.analyticalFunctionTypes(),
                               this->secondary_ );
  checkValue( this->LAT(), "LAT" );
}